

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  stbi__context *psVar1;
  stbi_uc sVar2;
  int iVar3;
  byte *pbVar4;
  stbi_uc *psVar5;
  uint uVar6;
  
  do {
    uVar6 = 0;
    if (j->nomore == 0) {
      psVar1 = j->s;
      pbVar4 = psVar1->img_buffer;
      if (psVar1->img_buffer_end <= pbVar4) {
        if (psVar1->read_from_callbacks == 0) goto LAB_00168bb9;
        psVar5 = psVar1->buffer_start;
        iVar3 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar5,psVar1->buflen);
        if (iVar3 == 0) {
          psVar1->read_from_callbacks = 0;
          psVar1->img_buffer = psVar5;
          psVar1->img_buffer_end = psVar1->buffer_start + 1;
          psVar1->buffer_start[0] = '\0';
        }
        else {
          psVar1->img_buffer = psVar5;
          psVar1->img_buffer_end = psVar5 + iVar3;
        }
        pbVar4 = psVar1->img_buffer;
      }
      psVar1->img_buffer = pbVar4 + 1;
      uVar6 = (uint)*pbVar4;
    }
LAB_00168bb9:
    if (uVar6 == 0xff) {
      psVar1 = j->s;
      psVar5 = psVar1->img_buffer;
      if (psVar5 < psVar1->img_buffer_end) {
LAB_00168c35:
        psVar1->img_buffer = psVar5 + 1;
        sVar2 = *psVar5;
      }
      else {
        if (psVar1->read_from_callbacks != 0) {
          psVar5 = psVar1->buffer_start;
          iVar3 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar5,psVar1->buflen);
          if (iVar3 == 0) {
            psVar1->read_from_callbacks = 0;
            psVar1->img_buffer = psVar5;
            psVar1->img_buffer_end = psVar1->buffer_start + 1;
            psVar1->buffer_start[0] = '\0';
          }
          else {
            psVar1->img_buffer = psVar5;
            psVar1->img_buffer_end = psVar5 + iVar3;
          }
          psVar5 = psVar1->img_buffer;
          goto LAB_00168c35;
        }
        sVar2 = '\0';
      }
      if (sVar2 != '\0') {
        j->marker = sVar2;
        j->nomore = 1;
        return;
      }
    }
    iVar3 = j->code_bits;
    j->code_buffer = j->code_buffer | uVar6 << (0x18U - (char)iVar3 & 0x1f);
    j->code_bits = iVar3 + 8;
    if (0x10 < iVar3) {
      return;
    }
  } while( true );
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}